

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O0

void __thiscall
LNodeF1Stmt::LNodeF1Stmt
          (LNodeF1Stmt *this,shared_ptr<LNode> *var,shared_ptr<LNode> *expr,shared_ptr<LNode> *stmts
          )

{
  shared_ptr<LNode> *stmts_local;
  shared_ptr<LNode> *expr_local;
  shared_ptr<LNode> *var_local;
  LNodeF1Stmt *this_local;
  
  std::shared_ptr<LNode>::shared_ptr(&this->var);
  std::shared_ptr<LNode>::shared_ptr(&this->expr);
  std::shared_ptr<LNode>::shared_ptr(&this->stmts);
  std::shared_ptr<LNode>::operator=(&this->var,var);
  std::shared_ptr<LNode>::operator=(&this->expr,expr);
  std::shared_ptr<LNode>::operator=(&this->stmts,stmts);
  return;
}

Assistant:

LNodeF1Stmt(std::shared_ptr<LNode> var, std::shared_ptr<LNode> expr, std::shared_ptr<LNode> stmts) {
        this->var = std::move(var);
        this->expr = std::move(expr);
        this->stmts = std::move(stmts);
    }